

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::Texture2DArrayView::gatherOffsetsCompare
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,
          IVec2 (*offsets) [4])

{
  ConstPixelBufferAccess *src;
  int iVar1;
  int depth;
  IVec2 (*in_RCX) [4];
  int iVar2;
  float fVar3;
  Vec4 VVar4;
  
  src = *(ConstPixelBufferAccess **)&sampler->wrapR;
  fVar3 = floorf(r + 0.5);
  iVar1 = (int)fVar3;
  iVar2 = (src->m_size).m_data[2] + -1;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  depth = 0;
  if (-1 < iVar1) {
    depth = iVar2;
  }
  VVar4 = gatherArray2DOffsetsCompare((tcu *)this,src,(Sampler *)offsets,ref,s,t,depth,in_RCX);
  return (Vec4)VVar4.m_data;
}

Assistant:

Vec4 Texture2DArrayView::gatherOffsetsCompare (const Sampler& sampler, float ref, float s, float t, float r, const IVec2 (&offsets)[4]) const
{
	return gatherArray2DOffsetsCompare(m_levels[0], sampler, ref, s, t, selectLayer(r), offsets);
}